

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

bool __thiscall
CorUnix::CPalSynchronizationManager::CreateProcessPipe(CPalSynchronizationManager *this)

{
  int iVar1;
  undefined8 local_20;
  int rgiPipe [2];
  
  local_20 = 0xffffffffffffffff;
  iVar1 = pipe((int *)&local_20);
  if (iVar1 == -1) {
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    if ((int)local_20 != -1) {
      close((int)local_20);
      close(local_20._4_4_);
    }
  }
  else {
    this->m_iProcessPipeRead = (int)local_20;
    this->m_iProcessPipeWrite = local_20._4_4_;
  }
  return iVar1 != -1;
}

Assistant:

bool CPalSynchronizationManager::CreateProcessPipe()
    {
        bool fRet = true;
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        int iKq = -1;
#endif // HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT

        int rgiPipe[] = { -1, -1 };
        if (pipe(rgiPipe) == -1)
        {
            ERROR("Unable to create the process pipe\n");
            fRet = false;
            goto CPP_exit;
        }

#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        iKq = kqueue();
        if (-1 == iKq)
        {
            ERROR("Failed to create kqueue associated to process pipe\n");
            fRet = false;
            goto CPP_exit;
        }
#endif // HAVE_KQUEUE

    CPP_exit:
        if (fRet)
        {
            // Succeeded
            m_iProcessPipeRead = rgiPipe[0];
            m_iProcessPipeWrite = rgiPipe[1];
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
            m_iKQueue = iKq;
#endif // HAVE_KQUEUE
        }
        else
        {
            if (-1 != rgiPipe[0])
            {
                close(rgiPipe[0]);
                close(rgiPipe[1]);
            }
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
            if (-1 != iKq)
            {
                close(iKq);
            }
#endif // HAVE_KQUEUE
        }

        return fRet;
    }